

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

void int_rel_reif(IntVar *x,IntRelType t,IntVar *y,BoolView *r,int c)

{
  IntRelType t_00;
  long lVar1;
  ulong uVar2;
  IntView<0> y_00;
  IntView<0> y_01;
  IntView<0> y_02;
  IntView<0> y_03;
  IntView<0> y_04;
  IntView<0> y_05;
  IntView<0> x_00;
  IntView<0> x_01;
  IntView<0> x_02;
  IntView<0> x_03;
  IntView<0> x_04;
  IntView<0> x_05;
  undefined1 auStack_58 [24];
  undefined8 uStack_40;
  BoolView local_38;
  
  if (IRT_GT < t) {
    uStack_40 = int_rel_half_reif;
    int_rel_reif();
    uStack_40._4_1_ = r->s;
    uStack_40._0_4_ = r->v;
    auStack_58._16_8_ = &PTR_finished_0020bb98;
    auStack_58._0_8_ = x;
    auStack_58._8_4_ = t;
    vec<IRR>::push(&ihrcs,(IRR *)auStack_58);
    return;
  }
  uVar2 = (ulong)(uint)c;
  switch(t) {
  case IRT_EQ:
    lVar1 = (uVar2 << 0x20) + 1;
    uStack_40._0_4_ = 0x1b0a63;
    uStack_40._4_1_ = false;
    uStack_40._5_3_ = 0;
    y_00._8_8_ = lVar1;
    y_00.var = y;
    x_00.a = 1;
    x_00.b = 0;
    x_00.var = x;
    newBinGE(x_00,y_00,r);
    uStack_40._0_4_ = 0x1b0a83;
    uStack_40._4_1_ = false;
    uStack_40._5_3_ = 0;
    y_01._8_8_ = ((ulong)(uint)-c << 0x20) + 1;
    y_01.var = x;
    x_01.a = 1;
    x_01.b = 0;
    x_01.var = y;
    newBinGE(x_01,y_01,r);
    local_38.v = r->v;
    local_38.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_38.s = (bool)(r->s ^ 1);
    uStack_40._0_4_ = 0x1b0abc;
    uStack_40._4_1_ = false;
    uStack_40._5_3_ = 0;
    y_02._8_8_ = lVar1;
    y_02.var = y;
    x_02.a = 1;
    x_02.b = 0;
    x_02.var = x;
    newBinNE(x_02,y_02,&local_38);
    return;
  case IRT_NE:
    local_38.v = r->v;
    local_38.s = (bool)(r->s ^ 1);
    t_00 = IRT_EQ;
    break;
  case IRT_LE:
    y_03._8_8_ = ((ulong)(uint)-c << 0x20) + 1;
    uStack_40._0_4_ = 0x1b0b11;
    uStack_40._4_1_ = false;
    uStack_40._5_3_ = 0;
    y_03.var = x;
    x_03.a = 1;
    x_03.b = 0;
    x_03.var = y;
    newBinGE(x_03,y_03,r);
    uVar2 = (ulong)(c + 1);
    goto LAB_001b0b38;
  case IRT_LT:
    y_04._8_8_ = ((ulong)(1 - c) << 0x20) + 1;
    uStack_40._0_4_ = 0x1b0b38;
    uStack_40._4_1_ = false;
    uStack_40._5_3_ = 0;
    y_04.var = x;
    x_04.a = 1;
    x_04.b = 0;
    x_04.var = y;
    newBinGE(x_04,y_04,r);
LAB_001b0b38:
    local_38.v = r->v;
    local_38.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_38.s = (bool)(r->s ^ 1);
    uStack_40._0_4_ = 0x1b0b78;
    uStack_40._4_1_ = false;
    uStack_40._5_3_ = 0;
    y_05._8_8_ = (uVar2 << 0x20) + 1;
    y_05.var = y;
    x_05.a = 1;
    x_05.b = 0;
    x_05.var = x;
    newBinGE(x_05,y_05,&local_38);
    return;
  case IRT_GE:
    local_38.v = r->v;
    local_38.s = (bool)(r->s ^ 1);
    t_00 = IRT_LT;
    break;
  case IRT_GT:
    local_38.v = r->v;
    local_38.s = (bool)(r->s ^ 1);
    t_00 = IRT_LE;
  }
  local_38.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
  uStack_40._0_4_ = 0x1b0bdc;
  uStack_40._4_1_ = false;
  uStack_40._5_3_ = 0;
  int_rel_reif(x,t_00,y,&local_38,c);
  return;
}

Assistant:

void int_rel_reif(IntVar* x, IntRelType t, IntVar* y, const BoolView& r, int c) {
	switch (t) {
		case IRT_EQ:
			newBinGE(IntView<>(x), IntView<>(y, 1, c), r);
			newBinGE(IntView<>(y), IntView<>(x, 1, -c), r);
			newBinNE(IntView<>(x), IntView<>(y, 1, c), ~r);
			break;
		case IRT_NE:
			int_rel_reif(x, IRT_EQ, y, ~r, c);
			break;
		case IRT_LE:
			// x <= y <-> r <=> y >= x <- r /\ x >= (y+1) <- !r
			newBinGE(IntView<>(y), IntView<>(x, 1, -c), r);
			newBinGE(IntView<>(x), IntView<>(y, 1, 1 + c), ~r);
			break;
		case IRT_LT:
			// x < y <-> r <=> y >= (x+1) <- r /\ x >= y <- !r
			newBinGE(IntView<>(y), IntView<>(x, 1, 1 - c), r);
			newBinGE(IntView<>(x), IntView<>(y, 1, c), ~r);
			break;
		case IRT_GE:
			int_rel_reif(x, IRT_LT, y, ~r, c);
			break;
		case IRT_GT:
			int_rel_reif(x, IRT_LE, y, ~r, c);
			break;
		default:
			NEVER;
	}
}